

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 SyLexTokenizeInput(SyLex *pLex,char *zInput,sxu32 nLen,void *pCtxData,ProcSort xSort,
                        ProcCmp xCmp)

{
  ulong uVar1;
  sxi32 sVar2;
  SyToken *aToken;
  undefined1 local_70 [4];
  sxi32 rc;
  SyToken sToken;
  SyStream *pStream;
  uchar *zCur;
  ProcCmp xCmp_local;
  ProcSort xSort_local;
  void *pCtxData_local;
  sxu32 nLen_local;
  char *zInput_local;
  SyLex *pLex_local;
  
  (pLex->sStream).zInput = (uchar *)zInput;
  (pLex->sStream).zText = (uchar *)zInput;
  (pLex->sStream).zEnd = (pLex->sStream).zInput + nLen;
  sToken.pUserData = pLex;
  do {
    if (*(ulong *)((long)sToken.pUserData + 0x10) <= *(ulong *)((long)sToken.pUserData + 8)) {
LAB_00136289:
      if ((xSort != (ProcSort)0x0) && (pLex->pTokenSet != (SySet *)0x0)) {
        zCur = (uchar *)xCmp;
        if (xCmp == (ProcCmp)0x0) {
          zCur = (uchar *)SyMemcmp;
        }
        (*xSort)(pLex->pTokenSet->pBase,pLex->pTokenSet->nUsed,0x20,(ProcCmp)zCur);
      }
      return 0;
    }
    uVar1 = *(ulong *)((long)sToken.pUserData + 8);
    sVar2 = (*pLex->xTokenizer)((SyStream *)sToken.pUserData,(SyToken *)local_70,pLex->pUserData,
                                pCtxData);
    if ((sVar2 != 0) && (sVar2 != -0x19)) {
      if (sVar2 == -10) {
        return -10;
      }
      goto LAB_00136289;
    }
    if (sVar2 == -0x19) {
      *(int *)((long)sToken.pUserData + 0x1c) = *(int *)((long)sToken.pUserData + 0x1c) + 1;
    }
    else if ((pLex->pTokenSet != (SySet *)0x0) &&
            (sVar2 = SySetPut(pLex->pTokenSet,local_70), sVar2 != 0)) goto LAB_00136289;
    if (*(ulong *)((long)sToken.pUserData + 8) <= uVar1) {
      *(ulong *)((long)sToken.pUserData + 8) = uVar1 + 1;
    }
  } while( true );
}

Assistant:

JX9_PRIVATE sxi32 SyLexTokenizeInput(SyLex *pLex, const char *zInput, sxu32 nLen, void *pCtxData, ProcSort xSort, ProcCmp xCmp)
{
	const unsigned char *zCur;
	SyStream *pStream;
	SyToken sToken;
	sxi32 rc;
#if defined (UNTRUST)
	if ( INVALID_LEXER(pLex) || zInput == 0 ){
		return SXERR_CORRUPT;
	}
#endif
	pStream = &pLex->sStream;
	/* Point to the head of the input */
	pStream->zText = pStream->zInput = (const unsigned char *)zInput;
	/* Point to the end of the input */
	pStream->zEnd = &pStream->zInput[nLen];
	for(;;){
		if( pStream->zText >= pStream->zEnd ){
			/* End of the input reached */
			break;
		}
		zCur = pStream->zText;
		/* Call the tokenizer callback */
		rc = pLex->xTokenizer(pStream, &sToken, pLex->pUserData, pCtxData);
		if( rc != SXRET_OK && rc != SXERR_CONTINUE ){
			/* Tokenizer callback request an operation abort */
			if( rc == SXERR_ABORT ){
				return SXERR_ABORT;
			}
			break;
		}
		if( rc == SXERR_CONTINUE ){
			/* Request to ignore this token */
			pStream->nIgn++;
		}else if( pLex->pTokenSet  ){
			/* Put the token in the set */
			rc = SySetPut(pLex->pTokenSet, (const void *)&sToken);
			if( rc != SXRET_OK ){
				break;
			}
		}
		if( zCur >= pStream->zText ){
			/* Automatic advance of the stream cursor */
			pStream->zText = &zCur[1];
		}
	}
	if( xSort &&  pLex->pTokenSet ){
		SyToken *aToken = (SyToken *)SySetBasePtr(pLex->pTokenSet);
		/* Sort the extrated tokens */
		if( xCmp == 0 ){
			/* Use a default comparison function */
			xCmp = SyMemcmp;
		}
		xSort(aToken, SySetUsed(pLex->pTokenSet), sizeof(SyToken), xCmp);
	}
	return SXRET_OK;
}